

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3VdbeMemRealify(Mem *pMem)

{
  uint uVar1;
  double dVar2;
  
  dVar2 = sqlite3VdbeRealValue(pMem);
  (pMem->u).r = dVar2;
  uVar1._0_2_ = pMem->flags;
  uVar1._2_1_ = pMem->enc;
  uVar1._3_1_ = pMem->eSubtype;
  uVar1 = uVar1 & 0xfffff240 | 8;
  pMem->flags = (u16)uVar1;
  return uVar1;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeMemRealify(Mem *pMem){
  assert( pMem!=0 );
  assert( pMem->db==0 || sqlite3_mutex_held(pMem->db->mutex) );
  assert( EIGHT_BYTE_ALIGNMENT(pMem) );

  pMem->u.r = sqlite3VdbeRealValue(pMem);
  MemSetTypeFlag(pMem, MEM_Real);
  return SQLITE_OK;
}